

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void remove_ssa_edge(ssa_edge_t_conflict ssa_edge)

{
  MIR_op_t *pMVar1;
  MIR_op_t *op_ref;
  ssa_edge_t_conflict ssa_edge_local;
  
  if (ssa_edge->prev_use == (ssa_edge_t)0x0) {
    pMVar1 = ssa_edge->def->insn->ops + ssa_edge->def_op_num;
    if ((ssa_edge_t_conflict)pMVar1->data != ssa_edge) {
      __assert_fail("op_ref->data == ssa_edge",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x965,"void remove_ssa_edge(ssa_edge_t)");
    }
    pMVar1->data = ssa_edge->next_use;
  }
  else {
    ssa_edge->prev_use->next_use = ssa_edge->next_use;
  }
  if (ssa_edge->next_use != (ssa_edge_t)0x0) {
    ssa_edge->next_use->prev_use = ssa_edge->prev_use;
  }
  if ((ssa_edge_t_conflict)ssa_edge->use->insn->ops[ssa_edge->use_op_num].data == ssa_edge) {
    ssa_edge->use->insn->ops[ssa_edge->use_op_num].data = (void *)0x0;
    free_ssa_edge(ssa_edge);
    return;
  }
  __assert_fail("ssa_edge->use->insn->ops[ssa_edge->use_op_num].data == ssa_edge",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x969,"void remove_ssa_edge(ssa_edge_t)");
}

Assistant:

static void remove_ssa_edge (ssa_edge_t ssa_edge) {
  if (ssa_edge->prev_use != NULL) {
    ssa_edge->prev_use->next_use = ssa_edge->next_use;
  } else {
    MIR_op_t *op_ref = &ssa_edge->def->insn->ops[ssa_edge->def_op_num];
    gen_assert (op_ref->data == ssa_edge);
    op_ref->data = ssa_edge->next_use;
  }
  if (ssa_edge->next_use != NULL) ssa_edge->next_use->prev_use = ssa_edge->prev_use;
  gen_assert (ssa_edge->use->insn->ops[ssa_edge->use_op_num].data == ssa_edge);
  ssa_edge->use->insn->ops[ssa_edge->use_op_num].data = NULL;
  free_ssa_edge (ssa_edge);
}